

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall Analyser::Static::Commodore::File::is_basic(File *this)

{
  value_type vVar1;
  ushort uVar2;
  ushort uVar3;
  size_type sVar4;
  reference pvVar5;
  uint local_20;
  uint16_t next_line_number;
  uint16_t next_line_address;
  int line_number;
  uint16_t line_address;
  File *this_local;
  
  if (this->type == RelocatableProgram) {
    local_20 = 0xffffffff;
    next_line_address = this->starting_address;
    while (uVar3 = this->starting_address,
          sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data),
          (ulong)(long)(int)((uint)next_line_address - (uint)uVar3) < sVar4 + 2) {
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->data,
                          (long)(int)((uint)next_line_address - (uint)this->starting_address));
      vVar1 = *pvVar5;
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->data,
                          (long)(int)(((uint)next_line_address - (uint)this->starting_address) + 1))
      ;
      uVar3 = CONCAT11(*pvVar5,vVar1);
      if (uVar3 == 0) {
        return true;
      }
      if ((uint)uVar3 < next_line_address + 5) {
        return false;
      }
      uVar2 = this->starting_address;
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
      if (sVar4 + 5 <= (ulong)(long)(int)((uint)next_line_address - (uint)uVar2)) {
        return false;
      }
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->data,
                          (long)(int)(((uint)next_line_address - (uint)this->starting_address) + 2))
      ;
      vVar1 = *pvVar5;
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->data,
                          (long)(int)(((uint)next_line_address - (uint)this->starting_address) + 3))
      ;
      if ((int)(uint)CONCAT11(*pvVar5,vVar1) <= (int)local_20) {
        return false;
      }
      local_20 = (uint)CONCAT11(*pvVar5,vVar1);
      next_line_address = uVar3;
    }
  }
  return false;
}

Assistant:

bool Analyser::Static::Commodore::File::is_basic() {
	// BASIC files are always relocatable (?)
	if(type != File::RelocatableProgram) return false;

	uint16_t line_address = starting_address;
	int line_number = -1;

	// decide whether this is a BASIC file based on the proposition that:
	//	(1) they're always relocatable; and
	//	(2) they have a per-line structure of:
	//		[4 bytes: address of start of next line]
	//		[4 bytes: this line number]
	//		... null-terminated code ...
	//	(with a next line address of 0000 indicating end of program)
	while(1) {
		if(size_t(line_address - starting_address) >= data.size() + 2) break;

		uint16_t next_line_address = data[line_address - starting_address];
		next_line_address |= data[line_address - starting_address + 1] << 8;

		if(!next_line_address) {
			return true;
		}
		if(next_line_address < line_address + 5) break;

		if(size_t(line_address - starting_address) >= data.size() + 5) break;
		uint16_t next_line_number = data[line_address - starting_address + 2];
		next_line_number |= data[line_address - starting_address + 3] << 8;

		if(next_line_number <= line_number) break;

		line_number = uint16_t(next_line_number);
		line_address = next_line_address;
	}

	return false;
}